

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::clear_all(timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
            *this)

{
  pointer pwVar1;
  timer_type *ptVar2;
  long lVar3;
  timer_type *t;
  wheel_item *item;
  pointer pwVar4;
  
  pwVar1 = (this->m_wheel).
           super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar4 = (this->m_wheel).
                super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
                ._M_impl.super__Vector_impl_data._M_start; pwVar4 != pwVar1; pwVar4 = pwVar4 + 1) {
    t = pwVar4->m_head;
    pwVar4->m_head = (timer_type *)0x0;
    pwVar4->m_tail = (timer_type *)0x0;
    while (t != (timer_type *)0x0) {
      ptVar2 = t->m_next;
      *(undefined4 *)&(t->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
      timer_object<timertt::thread_safety::unsafe>::decrement_references
                (&t->super_timer_object<timertt::thread_safety::unsafe>);
      t = ptVar2;
    }
  }
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_single_shot_count = 0;
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_periodic_count = 0;
  lVar3 = std::chrono::_V2::steady_clock::now();
  (this->m_current_tick_border).__d.__r = lVar3 + (this->m_granularity).__r;
  this->m_current_position = 0;
  return;
}

Assistant:

void
	clear_all()
	{
		for( auto & item : m_wheel )
		{
			timer_type * timer = item.m_head;
			item = wheel_item();

			while( timer )
			{
				timer_type * t = timer;
				timer = timer->m_next;

				t->m_status = timer_status::deactivated;
				timer_object< THREAD_SAFETY >::decrement_references( t );
			}
		}

		// For the case of timer_engine restart.
		this->reset_timer_count();
		this->m_current_tick_border = monotonic_clock::now() + m_granularity;
		this->m_current_position = 0;
	}